

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>
__thiscall kj::anon_unknown_36::NetworkAddressHttpClient::getClient(NetworkAddressHttpClient *this)

{
  _func_int *p_Var1;
  _func_int **pp_Var2;
  HttpHeaderTable *responseHeaderTable;
  OwnPromiseNode node;
  AsyncIoStream *pAVar3;
  Refcounted *refcounted;
  code *pcVar4;
  Timer *pTVar5;
  HttpClientImpl *this_00;
  _func_int *p_Var6;
  _func_int *p_Var7;
  RefcountedClient *in_RDX;
  RefcountedClient *extraout_RDX;
  RefcountedClient *extraout_RDX_00;
  RefcountedClient *extraout_RDX_01;
  RefcountedClient *extraout_RDX_02;
  RefcountedClient *extraout_RDX_03;
  RefcountedClient *extraout_RDX_04;
  _func_int **in_RSI;
  long *plVar8;
  _func_int **pp_Var9;
  byte bVar10;
  Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t> OVar11;
  Own<kj::AsyncIoStream,_std::nullptr_t> stream;
  OwnPromiseNode local_88;
  Disposer *local_80;
  AsyncIoStream *pAStack_78;
  Own<kj::AsyncIoStream,_std::nullptr_t> local_70;
  HttpClientSettings local_60;
  
  do {
    p_Var1 = in_RSI[0x15];
    if (p_Var1 == in_RSI[0x11]) {
      (*(code *)**(undefined8 **)in_RSI[4])(&local_88);
      newPromisedStream((kj *)&local_80,
                        (Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)&local_88);
      node.ptr = local_88.ptr;
      if (&(local_88.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
        local_88.ptr = (PromiseNode *)0x0;
        kj::_::PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
      }
      responseHeaderTable = (HttpHeaderTable *)in_RSI[2];
      this_00 = (HttpClientImpl *)operator_new(0x178);
      local_70.disposer = local_80;
      local_70.ptr = pAStack_78;
      pAStack_78 = (AsyncIoStream *)0x0;
      local_60.idleTimeout.value = (long)in_RSI[5];
      local_60.entropySource.ptr = (EntropySource *)in_RSI[6];
      local_60.errorHandler.ptr = (HttpClientErrorHandler *)in_RSI[7];
      local_60.webSocketCompressionMode = *(WebSocketCompressionMode *)(in_RSI + 8);
      local_60.webSocketErrorHandler.ptr = (WebSocketErrorHandler *)in_RSI[9];
      local_60.tlsContext.ptr = (SecureNetworkWrapper *)in_RSI[10];
      HttpClientImpl::HttpClientImpl(this_00,responseHeaderTable,&local_70,&local_60);
      pAVar3 = local_70.ptr;
      if (local_70.ptr != (AsyncIoStream *)0x0) {
        local_70.ptr = (AsyncIoStream *)0x0;
        (**(local_70.disposer)->_vptr_Disposer)
                  (local_70.disposer,
                   (pAVar3->super_AsyncInputStream)._vptr_AsyncInputStream[-2] +
                   (long)&(pAVar3->super_AsyncInputStream)._vptr_AsyncInputStream);
      }
      pTVar5 = (Timer *)operator_new(0x28);
      pAVar3 = pAStack_78;
      *(undefined4 *)&pTVar5[1].super_MonotonicClock._vptr_MonotonicClock = 0;
      (pTVar5->super_MonotonicClock)._vptr_MonotonicClock = (_func_int **)&PTR_disposeImpl_006401b0;
      pTVar5[2].super_MonotonicClock._vptr_MonotonicClock = in_RSI;
      pTVar5[3].super_MonotonicClock._vptr_MonotonicClock =
           (_func_int **)&kj::_::HeapDisposer<kj::(anonymous_namespace)::HttpClientImpl>::instance;
      pTVar5[4].super_MonotonicClock._vptr_MonotonicClock = (_func_int **)this_00;
      *(int *)(in_RSI + 0xd) = *(int *)(in_RSI + 0xd) + 1;
      *(undefined4 *)&pTVar5[1].super_MonotonicClock._vptr_MonotonicClock = 1;
      (this->super_HttpClient)._vptr_HttpClient = (_func_int **)pTVar5;
      this->timer = pTVar5;
      in_RDX = extraout_RDX_03;
      if (pAStack_78 != (AsyncIoStream *)0x0) {
        pAStack_78 = (AsyncIoStream *)0x0;
        (**local_80->_vptr_Disposer)(local_80,(long)pAVar3 + *(long *)(*(long *)pAVar3 + -0x10));
        in_RDX = extraout_RDX_04;
      }
      break;
    }
    p_Var7 = in_RSI[0x16];
    p_Var6 = p_Var1;
    if (p_Var1 == p_Var7) {
      p_Var6 = (_func_int *)(*(long *)(in_RSI[0x18] + -8) + 0x1f8);
    }
    pp_Var2 = *(_func_int ***)(p_Var6 + -0x18);
    pp_Var9 = *(_func_int ***)(p_Var6 + -0x10);
    *(undefined8 *)(p_Var6 + -0x10) = 0;
    if (p_Var1 == p_Var7) {
      operator_delete(p_Var7,0x1f8);
      p_Var1 = in_RSI[0x18];
      in_RSI[0x18] = p_Var1 + -8;
      p_Var1 = *(_func_int **)(p_Var1 + -8);
      in_RSI[0x16] = p_Var1;
      in_RSI[0x17] = p_Var1 + 0x1f8;
      p_Var7 = p_Var1 + 0x1e0;
      in_RSI[0x15] = p_Var7;
      plVar8 = *(long **)(p_Var1 + 0x1e8);
      in_RDX = extraout_RDX;
      if (plVar8 != (long *)0x0) {
        pcVar4 = p_Var1 + 0x1e8;
        goto LAB_003c4a7e;
      }
    }
    else {
      p_Var7 = p_Var1 + -0x18;
      in_RSI[0x15] = p_Var7;
      plVar8 = *(long **)(p_Var1 + -0x10);
      if (plVar8 != (long *)0x0) {
        pcVar4 = p_Var1 + -0x10;
LAB_003c4a7e:
        *(undefined8 *)pcVar4 = 0;
        (**(code **)**(undefined8 **)p_Var7)
                  (*(undefined8 **)p_Var7,(long)plVar8 + *(long *)(*plVar8 + -0x10));
        in_RDX = extraout_RDX_00;
      }
    }
    if ((*(code *)(pp_Var9 + 0x2e) == (code)0x0) && (*(code *)((long)pp_Var9 + 0x171) == (code)0x0))
    {
      bVar10 = 0;
      if ((*(code *)((long)pp_Var9 + 0xe1) == (code)0x0) && (*(int *)((long)pp_Var9 + 0xe4) == 0)) {
        if ((*(code *)(pp_Var9 + 0x23) != (code)0x0) ||
           (*(code *)((long)pp_Var9 + 0x119) != (code)0x0)) goto LAB_003c4aaa;
        bVar10 = (byte)*(code *)((long)pp_Var9 + 0x11a) ^ 1;
      }
    }
    else {
LAB_003c4aaa:
      bVar10 = 0;
    }
    if (bVar10 != 0) {
      pTVar5 = (Timer *)operator_new(0x28);
      *(undefined4 *)&pTVar5[1].super_MonotonicClock._vptr_MonotonicClock = 0;
      (pTVar5->super_MonotonicClock)._vptr_MonotonicClock = (_func_int **)&PTR_disposeImpl_006401b0;
      pTVar5[2].super_MonotonicClock._vptr_MonotonicClock = in_RSI;
      pTVar5[3].super_MonotonicClock._vptr_MonotonicClock = pp_Var2;
      pTVar5[4].super_MonotonicClock._vptr_MonotonicClock = pp_Var9;
      *(int *)(in_RSI + 0xd) = *(int *)(in_RSI + 0xd) + 1;
      *(undefined4 *)&pTVar5[1].super_MonotonicClock._vptr_MonotonicClock = 1;
      (this->super_HttpClient)._vptr_HttpClient = (_func_int **)pTVar5;
      this->timer = pTVar5;
      pp_Var9 = (_func_int **)0x0;
      in_RDX = extraout_RDX_01;
    }
    if (pp_Var9 != (_func_int **)0x0) {
      (**(code **)*pp_Var2)(pp_Var2,(_func_int *)((long)pp_Var9 + *(long *)(*pp_Var9 + -0x10)));
      in_RDX = extraout_RDX_02;
    }
  } while (bVar10 == 0);
  OVar11.ptr = in_RDX;
  OVar11.disposer = (Disposer *)this;
  return OVar11;
}

Assistant:

kj::Own<RefcountedClient> getClient() {
    for (;;) {
      if (availableClients.empty()) {
        auto stream = newPromisedStream(address->connect());
        return kj::refcounted<RefcountedClient>(*this,
          kj::heap<HttpClientImpl>(responseHeaderTable, kj::mv(stream), settings));
      } else {
        auto client = kj::mv(availableClients.back().client);
        availableClients.pop_back();
        if (client->canReuse()) {
          return kj::refcounted<RefcountedClient>(*this, kj::mv(client));
        }
        // Whoops, this client's connection was closed by the server at some point. Discard.
      }
    }
  }